

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O3

bool32 rw::instColor(int type,uint8 *dst,RGBA *src,uint32 numVertices,uint32 stride)

{
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  byte bVar4;
  
  bVar4 = 0xff;
  if (type == 10) {
    if (numVertices != 0) {
      pbVar2 = dst + 3;
      lVar3 = 0;
      do {
        pbVar2[-3] = src[lVar3].blue;
        pbVar2[-2] = src[lVar3].green;
        pbVar2[-1] = src[lVar3].red;
        bVar1 = src[lVar3].alpha;
        *pbVar2 = bVar1;
        bVar4 = bVar4 & bVar1;
        lVar3 = lVar3 + 1;
        pbVar2 = pbVar2 + stride;
      } while (numVertices != (uint32)lVar3);
    }
  }
  else if ((type == 0xb) && (numVertices != 0)) {
    pbVar2 = dst + 3;
    lVar3 = 0;
    do {
      pbVar2[-3] = src[lVar3].red;
      pbVar2[-2] = src[lVar3].green;
      pbVar2[-1] = src[lVar3].blue;
      bVar1 = src[lVar3].alpha;
      *pbVar2 = bVar1;
      bVar4 = bVar4 & bVar1;
      lVar3 = lVar3 + 1;
      pbVar2 = pbVar2 + stride;
    } while (numVertices != (uint32)lVar3);
  }
  return (bool32)(bVar4 != 0xff);
}

Assistant:

bool32
instColor(int type, uint8 *dst, RGBA *src, uint32 numVertices, uint32 stride)
{
	uint8 alpha = 0xFF;
	if(type == VERT_ARGB){
		for(uint32 i = 0; i < numVertices; i++){
			dst[0] = src->blue;
			dst[1] = src->green;
			dst[2] = src->red;
			dst[3] = src->alpha;
			alpha &= src->alpha;
			dst += stride;
			src++;
		}
	}else if(type == VERT_RGBA){
		for(uint32 i = 0; i < numVertices; i++){
			dst[0] = src->red;
			dst[1] = src->green;
			dst[2] = src->blue;
			dst[3] = src->alpha;
			alpha &= src->alpha;
			dst += stride;
			src++;
		}
	}else
		assert(0 && "unsupported color type");
	return alpha != 0xFF;
}